

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::asString
          (lang *this,unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *expr)

{
  Expr *pEVar1;
  long lVar2;
  undefined8 uVar3;
  Opcode OVar4;
  int iVar5;
  undefined8 *puVar6;
  
  iVar5 = (**(code **)((long)(((expr->_M_t).
                               super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                               .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl)->
                             super_ASTNode)._vptr_ASTNode + 0x18))();
  if (iVar5 == 3) {
    *(Expr **)this =
         (expr->_M_t).
         super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
         super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
         super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    (expr->_M_t).super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
    _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
    super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  }
  else {
    OVar4 = makeOperator(StringType,
                         (expr->_M_t).
                         super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                         .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl);
    if (OVar4 == EXIT) {
      *(undefined8 *)this = 0;
    }
    else {
      pEVar1 = (expr->_M_t).
               super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
               super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
               super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
      puVar6 = (undefined8 *)operator_new(0x50);
      *puVar6 = &PTR__ASTNode_001947b0;
      puVar6[1] = puVar6 + 3;
      lVar2 = *(long *)&(pEVar1->super_ASTNode).location_.filename._M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),lVar2,
                 *(size_type *)((long)&(pEVar1->super_ASTNode).location_ + 8) + lVar2);
      puVar6[7] = *(undefined8 *)((long)&(pEVar1->super_ASTNode).location_ + 0x30);
      uVar3 = *(undefined8 *)((long)&(pEVar1->super_ASTNode).location_ + 0x28);
      puVar6[5] = *(undefined8 *)((long)&(pEVar1->super_ASTNode).location_ + 0x20);
      puVar6[6] = uVar3;
      *puVar6 = &PTR__UnaryExpr_00194b48;
      *(Opcode *)(puVar6 + 8) = OVar4;
      puVar6[9] = (expr->_M_t).
                  super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                  .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
      (expr->_M_t).super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
      _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
      super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      *(undefined8 **)this = puVar6;
    }
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> asString(std::unique_ptr<Expr>&& expr) {
  LiteralType baseType = expr->getType();
  if (baseType == LiteralType::String) return std::move(expr);

  Opcode opc = makeOperator(Token::StringType, expr.get());
  if (opc == Opcode::EXIT) return nullptr;  // cast error

  return std::make_unique<UnaryExpr>(opc, std::move(expr), expr->location());
}